

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg.c
# Opt level: O2

_Bool tcg_region_alloc__locked(TCGContext_conflict9 *s)

{
  size_t *psVar1;
  size_t sVar2;
  size_t curr_region;
  void *end;
  void *start;
  void *local_38;
  void *local_30;
  
  sVar2 = (s->region).n;
  curr_region = (s->region).current;
  if (curr_region != sVar2) {
    tcg_region_bounds(s,curr_region,&local_30,&local_38);
    s->code_gen_buffer = local_30;
    s->code_gen_ptr = local_30;
    s->code_gen_buffer_size = (long)local_38 - (long)local_30;
    memset(local_30,0,(long)local_38 - (long)local_30);
    s->code_gen_highwater = (void *)((long)local_38 + -0x400);
    psVar1 = &(s->region).current;
    *psVar1 = *psVar1 + 1;
  }
  return curr_region == sVar2;
}

Assistant:

static bool tcg_region_alloc__locked(TCGContext *s)
{
    if (s->region.current == s->region.n) {
        return true;
    }
    tcg_region_assign(s, s->region.current);
    s->region.current++;
    return false;
}